

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O0

int __thiscall ncnn::CopyTo::load_param(CopyTo *this,ParamDict *pd)

{
  int *piVar1;
  int iVar2;
  Mat *pMVar3;
  ParamDict *in_RSI;
  long in_RDI;
  Mat local_2c0;
  Mat local_278;
  Mat local_220;
  Mat local_1d8;
  ParamDict *local_190;
  Mat *local_180;
  Mat *local_178;
  Mat *local_170;
  Mat *local_160;
  Mat *local_150;
  Mat *local_140;
  int local_130;
  undefined4 local_12c;
  Mat *local_128;
  Mat *local_120;
  Mat *local_118;
  int local_110;
  undefined4 local_10c;
  Mat *local_108;
  Mat *local_100;
  Mat *local_f8;
  int local_f0;
  undefined4 local_ec;
  Mat *local_e8;
  int local_e0;
  undefined4 local_dc;
  Mat *local_d8;
  int local_c0;
  undefined4 local_bc;
  Mat *local_b8;
  int local_a0;
  undefined4 local_9c;
  Mat *local_98;
  int local_80;
  undefined4 local_7c;
  Mat *local_78;
  int local_60;
  undefined4 local_5c;
  Mat *local_58;
  void *local_40;
  void *local_20;
  void *local_10;
  void *local_8;
  
  local_190 = in_RSI;
  iVar2 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar2;
  iVar2 = ParamDict::get(local_190,1,0);
  *(int *)(in_RDI + 0xd4) = iVar2;
  iVar2 = ParamDict::get(local_190,0xd,0);
  *(int *)(in_RDI + 0xd8) = iVar2;
  iVar2 = ParamDict::get(local_190,2,0);
  *(int *)(in_RDI + 0xdc) = iVar2;
  local_180 = &local_220;
  local_220.data = (void *)0x0;
  local_220.refcount = (int *)0x0;
  local_220.elemsize = 0;
  local_220.elempack = 0;
  local_220.allocator = (Allocator *)0x0;
  local_220.dims = 0;
  local_220.w = 0;
  local_220.h = 0;
  local_220.d = 0;
  local_220.c = 0;
  local_220.cstep = 0;
  ParamDict::get(&local_1d8,local_190,9,local_180);
  pMVar3 = (Mat *)(in_RDI + 0xe0);
  local_108 = &local_1d8;
  local_100 = pMVar3;
  if (pMVar3 != local_108) {
    if (local_1d8.refcount != (int *)0x0) {
      local_10c = 1;
      LOCK();
      local_110 = *local_1d8.refcount;
      *local_1d8.refcount = *local_1d8.refcount + 1;
      UNLOCK();
    }
    local_e8 = pMVar3;
    if (*(long *)(in_RDI + 0xe8) != 0) {
      piVar1 = *(int **)(in_RDI + 0xe8);
      local_ec = 0xffffffff;
      LOCK();
      local_f0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_f0 == 1) {
        if (*(long *)(in_RDI + 0x100) == 0) {
          local_8 = pMVar3->data;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x100) + 0x18))(*(long **)(in_RDI + 0x100),pMVar3->data)
          ;
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    *(undefined4 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x10c) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x114) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined8 *)(in_RDI + 0x120) = 0;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    pMVar3->data = local_108->data;
    *(int **)(in_RDI + 0xe8) = local_108->refcount;
    *(size_t *)(in_RDI + 0xf0) = local_108->elemsize;
    *(int *)(in_RDI + 0xf8) = local_108->elempack;
    *(Allocator **)(in_RDI + 0x100) = local_108->allocator;
    *(int *)(in_RDI + 0x108) = local_108->dims;
    *(int *)(in_RDI + 0x10c) = local_108->w;
    *(int *)(in_RDI + 0x110) = local_108->h;
    *(int *)(in_RDI + 0x114) = local_108->d;
    *(int *)(in_RDI + 0x118) = local_108->c;
    *(size_t *)(in_RDI + 0x120) = local_108->cstep;
  }
  local_170 = &local_1d8;
  local_f8 = pMVar3;
  local_58 = local_170;
  if (local_1d8.refcount != (int *)0x0) {
    local_5c = 0xffffffff;
    LOCK();
    local_60 = *local_1d8.refcount;
    *local_1d8.refcount = *local_1d8.refcount + -1;
    UNLOCK();
    if (local_60 == 1) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])(local_1d8.allocator,local_1d8.data);
      }
    }
  }
  local_1d8.data = (void *)0x0;
  local_1d8.elemsize = 0;
  local_1d8.elempack = 0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  local_1d8.cstep = 0;
  local_1d8.refcount = (int *)0x0;
  local_160 = &local_220;
  local_78 = local_160;
  if (local_220.refcount != (int *)0x0) {
    local_7c = 0xffffffff;
    LOCK();
    local_80 = *local_220.refcount;
    *local_220.refcount = *local_220.refcount + -1;
    UNLOCK();
    if (local_80 == 1) {
      if (local_220.allocator == (Allocator *)0x0) {
        local_40 = local_220.data;
        if (local_220.data != (void *)0x0) {
          free(local_220.data);
        }
      }
      else {
        (*(local_220.allocator)->_vptr_Allocator[3])(local_220.allocator,local_220.data);
      }
    }
  }
  local_220.data = (void *)0x0;
  local_220.elemsize = 0;
  local_220.elempack = 0;
  local_220.dims = 0;
  local_220.w = 0;
  local_220.h = 0;
  local_220.d = 0;
  local_220.c = 0;
  local_220.cstep = 0;
  local_220.refcount = (int *)0x0;
  local_178 = &local_2c0;
  local_2c0.data = (void *)0x0;
  local_2c0.refcount = (int *)0x0;
  local_2c0.elemsize = 0;
  local_2c0.elempack = 0;
  local_2c0.allocator = (Allocator *)0x0;
  local_2c0.dims = 0;
  local_2c0.w = 0;
  local_2c0.h = 0;
  local_2c0.d = 0;
  local_2c0.c = 0;
  local_2c0.cstep = 0;
  ParamDict::get(&local_278,local_190,0xb,local_178);
  pMVar3 = (Mat *)(in_RDI + 0x128);
  local_128 = &local_278;
  local_120 = pMVar3;
  if (pMVar3 != local_128) {
    if (local_278.refcount != (int *)0x0) {
      local_12c = 1;
      LOCK();
      local_130 = *local_278.refcount;
      *local_278.refcount = *local_278.refcount + 1;
      UNLOCK();
    }
    local_d8 = pMVar3;
    if (*(long *)(in_RDI + 0x130) != 0) {
      piVar1 = *(int **)(in_RDI + 0x130);
      local_dc = 0xffffffff;
      LOCK();
      local_e0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_e0 == 1) {
        if (*(long *)(in_RDI + 0x148) == 0) {
          local_10 = pMVar3->data;
          if (local_10 != (void *)0x0) {
            free(local_10);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x148) + 0x18))(*(long **)(in_RDI + 0x148),pMVar3->data)
          ;
        }
      }
    }
    pMVar3->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *(undefined4 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x150) = 0;
    *(undefined4 *)(in_RDI + 0x154) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined8 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    pMVar3->data = local_128->data;
    *(int **)(in_RDI + 0x130) = local_128->refcount;
    *(size_t *)(in_RDI + 0x138) = local_128->elemsize;
    *(int *)(in_RDI + 0x140) = local_128->elempack;
    *(Allocator **)(in_RDI + 0x148) = local_128->allocator;
    *(int *)(in_RDI + 0x150) = local_128->dims;
    *(int *)(in_RDI + 0x154) = local_128->w;
    *(int *)(in_RDI + 0x158) = local_128->h;
    *(int *)(in_RDI + 0x15c) = local_128->d;
    *(int *)(in_RDI + 0x160) = local_128->c;
    *(size_t *)(in_RDI + 0x168) = local_128->cstep;
  }
  local_150 = &local_278;
  local_118 = pMVar3;
  local_98 = local_150;
  if (local_278.refcount != (int *)0x0) {
    local_9c = 0xffffffff;
    LOCK();
    local_a0 = *local_278.refcount;
    *local_278.refcount = *local_278.refcount + -1;
    UNLOCK();
    if (local_a0 == 1) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator,local_278.data);
      }
    }
  }
  local_278.data = (void *)0x0;
  local_278.elemsize = 0;
  local_278.elempack = 0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  local_278.cstep = 0;
  local_278.refcount = (int *)0x0;
  local_140 = &local_2c0;
  if (local_2c0.refcount != (int *)0x0) {
    local_bc = 0xffffffff;
    LOCK();
    local_c0 = *local_2c0.refcount;
    *local_2c0.refcount = *local_2c0.refcount + -1;
    UNLOCK();
    if (local_c0 == 1) {
      local_b8 = local_140;
      if (local_2c0.allocator == (Allocator *)0x0) {
        local_20 = local_2c0.data;
        if (local_2c0.data != (void *)0x0) {
          free(local_2c0.data);
        }
      }
      else {
        (*(local_2c0.allocator)->_vptr_Allocator[3])(local_2c0.allocator,local_2c0.data);
      }
    }
  }
  return 0;
}

Assistant:

int CopyTo::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    doffset = pd.get(13, 0);
    coffset = pd.get(2, 0);

    starts = pd.get(9, Mat());
    axes = pd.get(11, Mat());

    return 0;
}